

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

void __thiscall QPDFObjectHandle::warnIfPossible(QPDFObjectHandle *this,string *warning)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  QPDFObject *this_00;
  QPDF *qpdf;
  bool bVar2;
  Pipeline *this_01;
  QPDF *context;
  string description;
  QPDF *local_e8;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [128];
  
  local_e8 = (QPDF *)0x0;
  paVar1 = &local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  if (this_00 != (QPDFObject *)0x0) {
    bVar2 = QPDFObject::getDescription(this_00,&local_e8,&local_c0);
    qpdf = local_e8;
    if (bVar2) {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
      QPDFExc::QPDFExc((QPDFExc *)local_a0,qpdf_e_damaged_pdf,&local_e0,&local_c0,0,warning);
      warn(qpdf,(QPDFExc *)local_a0);
      QPDFExc::~QPDFExc((QPDFExc *)local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001c2fb9;
    }
  }
  QPDFLogger::defaultLogger();
  QPDFLogger::getError((QPDFLogger *)local_a0,SUB81(local_e0._M_dataplus._M_p,0));
  this_01 = Pipeline::operator<<((Pipeline *)local_a0._0_8_,warning);
  Pipeline::operator<<(this_01,"\n");
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_string_length);
  }
LAB_001c2fb9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::warnIfPossible(std::string const& warning) const
{
    QPDF* context = nullptr;
    std::string description;
    if (obj && obj->getDescription(context, description)) {
        warn(context, QPDFExc(qpdf_e_damaged_pdf, "", description, 0, warning));
    } else {
        *QPDFLogger::defaultLogger()->getError() << warning << "\n";
    }
}